

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easm.c
# Opt level: O3

int easm_isimm(easm_expr *expr)

{
  easm_expr_type eVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  
  iVar4 = 0;
  do {
    eVar1 = expr->type;
    if (eVar1 - EASM_EXPR_LOR < 0xc) {
      iVar2 = easm_isimm(expr->e1);
      lVar3 = 0x10;
      if (iVar2 == 0) {
        return 0;
      }
    }
    else {
      lVar3 = 8;
      if (2 < eVar1 - EASM_EXPR_NEG) {
        if ((eVar1 == EASM_EXPR_NUM) || (eVar1 == EASM_EXPR_LABEL)) {
          iVar4 = 1;
        }
        return iVar4;
      }
    }
    expr = *(easm_expr **)((long)&expr->type + lVar3);
  } while( true );
}

Assistant:

int easm_isimm(struct easm_expr *expr) {
	switch (expr->type) {
		case EASM_EXPR_LOR:
		case EASM_EXPR_LAND:
		case EASM_EXPR_OR:
		case EASM_EXPR_XOR:
		case EASM_EXPR_AND:
		case EASM_EXPR_SHL:
		case EASM_EXPR_SHR:
		case EASM_EXPR_ADD:
		case EASM_EXPR_SUB:
		case EASM_EXPR_MUL:
		case EASM_EXPR_DIV:
		case EASM_EXPR_MOD:
			return easm_isimm(expr->e1) && easm_isimm(expr->e2);
		case EASM_EXPR_NEG:
		case EASM_EXPR_NOT:
		case EASM_EXPR_LNOT:
			return easm_isimm(expr->e1);
		case EASM_EXPR_NUM:
		case EASM_EXPR_LABEL:
			return 1;
		default:
			return 0;
	}
}